

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distance.cpp
# Opt level: O0

double Distance::getWeightedRobinsonFouldsDistance
                 (string *t1,string *t2,bool normalise,bool rooted1,bool rooted2)

{
  byte bVar1;
  byte in_CL;
  byte bVar2;
  byte in_DL;
  byte bVar3;
  string *in_RSI;
  string *in_RDI;
  byte in_R8B;
  double dVar4;
  PhyloTree b;
  PhyloTree a;
  undefined1 in_stack_00000417;
  string *in_stack_00000418;
  PhyloTree *in_stack_00000420;
  PhyloTree *this;
  string local_138 [152];
  PhyloTree local_a0;
  undefined1 in_stack_ffffffffffffffdf;
  PhyloTree *in_stack_ffffffffffffffe0;
  undefined5 in_stack_ffffffffffffffe8;
  
  bVar3 = in_DL & 1;
  bVar2 = in_CL & 1;
  bVar1 = in_R8B & 1;
  this = &local_a0;
  std::__cxx11::string::string((string *)this,in_RDI);
  PhyloTree::PhyloTree(in_stack_00000420,in_stack_00000418,(bool)in_stack_00000417);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string(local_138,in_RSI);
  PhyloTree::PhyloTree(in_stack_00000420,in_stack_00000418,(bool)in_stack_00000417);
  std::__cxx11::string::~string(local_138);
  dVar4 = getWeightedRobinsonFouldsDistance
                    ((PhyloTree *)
                     CONCAT17(bVar3,CONCAT16(bVar2,CONCAT15(bVar1,in_stack_ffffffffffffffe8))),
                     in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  PhyloTree::~PhyloTree(this);
  PhyloTree::~PhyloTree(this);
  return dVar4;
}

Assistant:

double Distance::getWeightedRobinsonFouldsDistance(const string& t1, const string& t2, bool normalise, bool rooted1, bool rooted2) {
    PhyloTree a(t1, rooted1);
    PhyloTree b(t2, rooted2);
    return getWeightedRobinsonFouldsDistance(a, b, normalise);
}